

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

void __thiscall
Hospital::Update_Doctors_Time_Table_File
          (Hospital *this,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *Doctors_Timetable,ofstream *inFile)

{
  long lVar1;
  long lVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  undefined1 local_239;
  long local_238;
  ofstream abus;
  
  system("pause");
  std::ofstream::ofstream(&abus);
  std::ofstream::open((char *)&abus,0x11c161);
  lVar5 = 0;
  while (lVar5 != 7) {
    local_238 = lVar5;
    for (lVar6 = 0; lVar6 != 0xc0; lVar6 = lVar6 + 0x20) {
      lVar1 = *(long *)&(Doctors_Timetable->
                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[lVar5].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      local_239 = 0x20;
      _Var3 = std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (*(char **)(lVar1 + lVar6),
                         *(char **)(lVar1 + lVar6) + *(long *)(lVar1 + 8 + lVar6),
                         (_Iter_equals_val<const_char>)&local_239);
      lVar2 = *(long *)&(Doctors_Timetable->
                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[lVar5].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      std::__cxx11::string::erase
                (lVar1 + lVar6,_Var3._M_current,
                 *(long *)(lVar2 + lVar6) + *(long *)(lVar2 + 8 + lVar6));
      poVar4 = std::operator<<((ostream *)&abus,
                               (string *)
                               (*(long *)&(Doctors_Timetable->
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start[lVar5].
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data + lVar6));
      std::operator<<(poVar4," ");
    }
    std::operator<<((ostream *)&abus,"\n");
    lVar5 = local_238 + 1;
  }
  std::ofstream::~ofstream(&abus);
  return;
}

Assistant:

void Hospital:: Update_Doctors_Time_Table_File (vector<vector<string>> Doctors_Timetable , ofstream& inFile) {

    system("pause");
    //  cout << "hiiiii";
    ofstream abus;
    abus.open("Doctors_Timetable.txt");
    //abus <<"Asghar";

    for (int i = 0; i < 7; i++) {
        for (int j = 0; j < 6; ++j) {
            Doctors_Timetable[i][j] .erase(remove(Doctors_Timetable[i][j] .begin(), Doctors_Timetable[i][j] .end(), ' '), Doctors_Timetable[i][j] .end());
            //    Doctors_Timetable[i][j].erase(std::remove_if(Doctors_Timetable[i][j].begin(), Doctors_Timetable[i][j].end(), ::isspace), Doctors_Timetable[i][j].end());
                abus << Doctors_Timetable[i][j] << " ";
//            abus <<"Asghar";
        }
        abus << "\n";
    }
    //inFile.close();

}